

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O0

ActionMessage * __thiscall helics::ActionMessage::operator=(ActionMessage *this,ActionMessage *act)

{
  action_t *in_RSI;
  ActionMessage *in_RDI;
  SmallBuffer *unaff_retaddr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000088;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000090;
  
  in_RDI->messageAction = *in_RSI;
  in_RDI->messageID = in_RSI[1];
  (in_RDI->source_id).gid = in_RSI[2];
  (in_RDI->source_handle).hid = in_RSI[3];
  (in_RDI->dest_id).gid = in_RSI[4];
  (in_RDI->dest_handle).hid = in_RSI[5];
  in_RDI->counter = (short)in_RSI[6];
  in_RDI->flags = *(uint16_t *)((long)in_RSI + 0x1a);
  in_RDI->sequenceID = in_RSI[7];
  (in_RDI->actionTime).internalTimeCode = *(undefined8 *)(in_RSI + 8);
  (in_RDI->Te).internalTimeCode = *(undefined8 *)(in_RSI + 10);
  (in_RDI->Tdemin).internalTimeCode = *(undefined8 *)(in_RSI + 0xc);
  (in_RDI->Tso).internalTimeCode = *(undefined8 *)(in_RSI + 0xe);
  SmallBuffer::operator=((SmallBuffer *)act,unaff_retaddr);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(in_stack_00000090,in_stack_00000088);
  return in_RDI;
}

Assistant:

ActionMessage& ActionMessage::operator=(const ActionMessage& act)  // NOLINT
{
    messageAction = act.messageAction;
    messageID = act.messageID;
    source_id = act.source_id;
    source_handle = act.source_handle;
    dest_id = act.dest_id;
    dest_handle = act.dest_handle;
    counter = act.counter;
    flags = act.flags;
    sequenceID = act.sequenceID;
    actionTime = act.actionTime;
    Te = act.Te;
    Tdemin = act.Tdemin;
    Tso = act.Tso;
    payload = act.payload;
    stringData = act.stringData;
    return *this;
}